

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericunixtheme.cpp
# Opt level: O0

bool QGenericUnixTheme::isDBusGlobalMenuAvailable(void)

{
  int iVar1;
  
  if (isDBusGlobalMenuAvailable()::dbusGlobalMenuAvailable == '\0') {
    iVar1 = __cxa_guard_acquire(&isDBusGlobalMenuAvailable()::dbusGlobalMenuAvailable);
    if (iVar1 != 0) {
      isDBusGlobalMenuAvailable::dbusGlobalMenuAvailable = checkDBusGlobalMenuAvailable();
      __cxa_guard_release(&isDBusGlobalMenuAvailable()::dbusGlobalMenuAvailable);
    }
  }
  return (bool)(isDBusGlobalMenuAvailable::dbusGlobalMenuAvailable & 1);
}

Assistant:

bool QGenericUnixTheme::isDBusGlobalMenuAvailable()
{
    static bool dbusGlobalMenuAvailable = checkDBusGlobalMenuAvailable();
    return dbusGlobalMenuAvailable;
}